

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O3

vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> * __thiscall
Cipher::Processor::getClusterings
          (vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *__return_storage_ptr__,
          Processor *this,int nClusterings)

{
  double dVar1;
  pointer piVar2;
  pointer pTVar3;
  pointer pTVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  TSimilarityMap *pTVar9;
  pointer pvVar10;
  int iVar11;
  TClusters *__x;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  __normal_iterator<Cipher::TResult_*,_std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>_>
  __i;
  pointer pTVar17;
  ulong uVar18;
  float fVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  double dVar23;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *result;
  TClusters clustersNew;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> all;
  int local_bc;
  double local_b0;
  vector<int,_std::allocator<int>_> local_98;
  double local_80;
  ulong local_78;
  double local_70;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> local_68;
  double local_48;
  value_type *local_40;
  double local_38;
  
  __x = &(this->m_curResult).clusters;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__x);
  uVar18 = (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = &this->m_curResult;
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
            (&local_68,&this->m_curResult);
  local_b0 = (double)(this->m_params).temp0;
  local_48 = (double)(this->m_params).coolingRate;
  uVar8 = (uint)(uVar18 >> 2);
  local_70 = (double)(int)((uVar8 - 1) * uVar8) * 0.5;
  local_78 = 0;
  local_bc = 0;
  do {
    std::vector<int,_std::allocator<int>_>::operator=(&local_98,__x);
    iVar5 = rand();
    iVar13 = (int)((long)iVar5 % (long)(int)uVar8);
    iVar11 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar13];
    do {
      iVar6 = rand();
      iVar6 = iVar6 % ((this->m_params).maxClusters + -1) + 1;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar13] = iVar6;
    } while (iVar6 == iVar11);
    dVar1 = this->m_pCur;
    local_80 = local_70 * dVar1;
    if (0 < (int)uVar8) {
      piVar2 = (this->m_curResult).clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = 0;
      uVar18 = 0;
      do {
        if (((long)iVar5 % (long)(int)uVar8 & 0xffffffffU) != uVar18) {
          pTVar9 = &this->m_logMapInv;
          if (piVar2[uVar18] == piVar2[iVar13]) {
            pTVar9 = &this->m_logMap;
          }
          pvVar10 = (this->m_logMapInv).
                    super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar18] == iVar6) {
            pvVar10 = (this->m_logMap).
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          local_80 = (local_80 -
                     *(double *)
                      (*(long *)&(pTVar9->
                                 super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar13].
                                 super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                                 super__Vector_impl_data + lVar14)) +
                     *(double *)
                      (*(long *)&pvVar10[iVar13].
                                 super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                                 super__Vector_impl_data + lVar14);
        }
        uVar18 = uVar18 + 1;
        lVar14 = lVar14 + 0x10;
      } while ((uVar8 & 0x7fffffff) != uVar18);
    }
    local_80 = local_80 / local_70;
    if (dVar1 <= local_80) {
      std::vector<int,_std::allocator<int>_>::operator=(__x,&local_98);
LAB_00115fbc:
      uVar20 = SUB84(local_80,0);
      uVar21 = (undefined4)((ulong)local_80 >> 0x20);
      (this->m_curResult).pClusters = local_80;
      this->m_pCur = local_80;
    }
    else {
      local_38 = exp((local_80 - dVar1) / local_b0);
      fVar19 = frand();
      if ((double)fVar19 < local_38) {
        std::vector<int,_std::allocator<int>_>::operator=(__x,&local_98);
        goto LAB_00115fbc;
      }
      uVar20 = SUB84(this->m_pCur,0);
      uVar21 = (undefined4)((ulong)this->m_pCur >> 0x20);
    }
    if ((double)CONCAT44(uVar21,uVar20) <
        local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].pClusters ||
        (double)CONCAT44(uVar21,uVar20) ==
        local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].pClusters) {
      local_bc = local_bc + 1;
    }
    else {
      local_bc = 0;
      std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back(&local_68,local_40);
    }
    uVar7 = (int)local_78 + 1;
    local_78 = (ulong)uVar7;
    if (((uVar7 * 0x26e978d5 >> 3 | uVar7 * -0x60000000) < 0x418938) &&
       (local_b0 = local_b0 * local_48, local_b0 < 1e-06)) {
      local_b0 = 1e-06;
    }
  } while ((local_bc < 0x3e9) || (2e-06 <= local_b0));
  dVar1 = local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].pClusters;
  (__return_storage_ptr__->super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
            (__return_storage_ptr__,
             local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
  if (1 < nClusterings) {
    iVar11 = 1;
    while( true ) {
      lVar14 = (long)local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      iVar13 = (int)lVar14 * -0x45d1745d;
      iVar5 = (int)((ulong)(lVar14 * -0x1745d1745d1745d1) / 6);
      if (iVar13 <= iVar5) break;
      pTVar3 = (__return_storage_ptr__->
               super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (int)((long)(__return_storage_ptr__->
                          super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
              -0x45d1745d;
      uVar12 = (ulong)iVar5;
      uVar18 = 0xffffffff;
      uVar20 = 0;
      uVar21 = 0xbff00000;
      do {
        if (dVar1 * 1.1 <=
            local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].pClusters) {
          dVar22 = 1.79769313486232e+308;
          if (0 < (int)uVar8) {
            uVar15 = (ulong)(uVar8 & 0x7fffffff);
            pdVar16 = &pTVar3->pClusters;
            dVar23 = 1.79769313486232e+308;
            do {
              dVar22 = ABS(local_68.
                           super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar12].pClusters - *pdVar16);
              if (dVar23 <= dVar22) {
                dVar22 = dVar23;
              }
              pdVar16 = pdVar16 + 0xb;
              uVar15 = uVar15 - 1;
              dVar23 = dVar22;
            } while (uVar15 != 0);
          }
          if ((double)CONCAT44(uVar21,uVar20) <= dVar22 && dVar22 != (double)CONCAT44(uVar21,uVar20)
             ) {
            uVar18 = uVar12 & 0xffffffff;
          }
          if (dVar22 <= (double)CONCAT44(uVar21,uVar20)) {
            dVar22 = (double)CONCAT44(uVar21,uVar20);
          }
          uVar20 = SUB84(dVar22,0);
          uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != (long)iVar13);
      if (((double)CONCAT44(uVar21,uVar20) <= 0.005 && (double)CONCAT44(uVar21,uVar20) != 0.005) ||
         ((int)uVar18 == -1)) break;
      std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
                (__return_storage_ptr__,
                 local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>.
                 _M_impl.super__Vector_impl_data._M_start + (int)uVar18);
      iVar11 = iVar11 + 1;
      if (iVar11 == nClusterings) break;
    }
  }
  pTVar3 = (__return_storage_ptr__->
           super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar4 = (__return_storage_ptr__->
           super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar3 != pTVar4) {
    uVar18 = ((long)pTVar4 - (long)pTVar3 >> 3) * 0x2e8ba2e8ba2e8ba3;
    lVar14 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
              (pTVar3,pTVar4,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar4 - (long)pTVar3 < 0x581) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
                (pTVar3,pTVar4);
    }
    else {
      pTVar17 = pTVar3 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
                (pTVar3,pTVar17);
      for (; pTVar17 != pTVar4; pTVar17 = pTVar17 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,__gnu_cxx::__ops::_Val_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
                  (pTVar17);
      }
    }
  }
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::~vector(&local_68);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TResult> Processor::getClusterings(int nClusterings) {
        const auto p0 = m_curResult.pClusters;
        //printf("    [getClusterings] p0 = %g\n", p0);

        int nNoImprovement = 0;
        int nTotalIterations = 0;
        auto clustersNew = m_curResult.clusters;
        const int n = clustersNew.size();

        std::vector<TResult> all;
        all.push_back(m_curResult);

        // simulated annealing
        double T = m_params.temp0;
        const double TMin = 0.000001;
        const double alpha = m_params.coolingRate;
        const double pScale = ((n*(n-1))/2.0);

        while (true) {
            clustersNew = m_curResult.clusters;

            // mutate
            int idxChanged = -1;
            {
                idxChanged = rand()%n;

                auto old = clustersNew[idxChanged];
                do {
                    clustersNew[idxChanged] = 1 + rand()%(m_params.maxClusters - 1);
                } while (clustersNew[idxChanged] == old);
            }

            // compute pNew
            auto pNew = m_pCur*pScale;
            {
                const int j = idxChanged;
                for (int i = 0; i < n; ++i) {
                    if (i == j) {
                        continue;
                    }

                    if (m_curResult.clusters[i] == m_curResult.clusters[j]) {
                        pNew -= m_logMap[j][i].cc;
                    } else {
                        pNew -= m_logMapInv[j][i].cc;
                    }

                    if (clustersNew[i] == clustersNew[j]) {
                        pNew += m_logMap[j][i].cc;
                    } else {
                        pNew += m_logMapInv[j][i].cc;
                    }
                }

                pNew /= pScale;
            }

            // check if we should accept the new value
            if (pNew >= m_pCur) {
                m_curResult.clusters = clustersNew;
                m_curResult.pClusters = pNew;
                m_pCur = pNew;
            } else {
                // accept with probability
                const auto pAccept = std::exp((pNew - m_pCur)/T);
                if (pAccept > frand()) {
                    //printf("    [getClusterings] N = %5d, T = %8.8f, pNew = %g, pCur = %g, pAccept = %g\n", nNoImprovement, T, pNew, m_pCur, pAccept);
                    m_curResult.clusters = clustersNew;
                    m_curResult.pClusters = pNew;
                    m_pCur = pNew;
                }
            }

            // check if we should stop
            if (m_pCur > all.back().pClusters) {
                all.push_back(m_curResult);
                nNoImprovement = 0;
            } else {
                nNoImprovement += 1;
            }

            // update temperature
            nTotalIterations++;
            if (nTotalIterations % 1000 == 0) {
                T = T * alpha;
                if (T < TMin) {
                    T = TMin;
                }
                //printf("    [getClusterings] T = %g\n", T);
            }

            if (nNoImprovement > 1000 && T < 2*TMin) {
                break;
            }
        }

        //printf("    [getClusterings] nTotalIterations = %d\n", nTotalIterations);
        //printf("    [getClusterings] pFinal = %g\n", m_curResult.pClusters);

        const auto pClustersBest = all.back().pClusters;

        std::vector<TResult> result;
        {
            result.push_back(all.back());

            for (int i = 1; i < nClusterings; ++i) {
                int jBest = -1;
                double pDiffMax = -1.0;
                for (int j = 5*all.size()/6; j < (int) all.size(); ++j) {
                    if (all[j].pClusters < 1.1*pClustersBest) {
                        continue;
                    }
                    double pDiffMin = std::numeric_limits<double>::max();
                    for (int k = 0; k < (int) result.size(); ++k) {
                        double pDiff = std::fabs(all[j].pClusters - result[k].pClusters);
                        if (pDiffMin > pDiff) {
                            pDiffMin = pDiff;
                        }
                    }
                    if (pDiffMax < pDiffMin) {
                        pDiffMax = pDiffMin;
                        jBest = j;
                    }
                }

                if (pDiffMax < 0.005 || jBest == -1) {
                    break;
                }

                result.push_back(all[jBest]);
            }
        }

        std::sort(result.begin(), result.end(), [](const TResult & a, const TResult & b) {
            return a.pClusters > b.pClusters;
        });

        return result;
    }